

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

string * __thiscall
chrono::ChEnumMapper<myEnum>::GetValueAsString_abi_cxx11_
          (string *__return_storage_ptr__,ChEnumMapper<myEnum> *this)

{
  uint uVar1;
  ulong uVar2;
  element_type *peVar3;
  size_type sVar4;
  reference pvVar5;
  allocator local_27;
  char local_26 [8];
  char buffer [10];
  int i;
  ChEnumMapper<myEnum> *this_local;
  
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  unique0x10000139 = this;
  while( true ) {
    uVar2 = (ulong)(int)buffer._2_4_;
    peVar3 = std::
             __shared_ptr_access<std::vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->enummap);
    sVar4 = std::
            vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>
            ::size(peVar3);
    if (sVar4 <= uVar2) {
      uVar1 = (**(this->super_ChEnumMapperBase)._vptr_ChEnumMapperBase)();
      sprintf(local_26,"%d",(ulong)uVar1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,local_26,&local_27);
      std::allocator<char>::~allocator((allocator<char> *)&local_27);
      return __return_storage_ptr__;
    }
    peVar3 = std::
             __shared_ptr_access<std::vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->enummap);
    pvVar5 = std::
             vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>
             ::at(peVar3,(long)(int)buffer._2_4_);
    if (pvVar5->enumid == *this->value_ptr) break;
    buffer._2_4_ = buffer._2_4_ + 1;
  }
  peVar3 = std::
           __shared_ptr_access<std::vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->enummap);
  pvVar5 = std::
           vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>
           ::at(peVar3,(long)(int)buffer._2_4_);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar5);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string GetValueAsString() override {
        for (int i = 0; i < enummap->size(); ++i)
        {
            if(enummap->at(i).enumid == *value_ptr)
                return enummap->at(i).name;
        }
        // not found, just string as number:
        char buffer [10];
        sprintf(buffer, "%d", GetValueAsInt());
        return std::string(buffer);
    }